

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O1

int wally_ec_sig_from_der(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  secp256k1_context *ctx;
  int iVar1;
  bool bVar2;
  bool bVar3;
  secp256k1_ecdsa_signature sig_secp;
  secp256k1_ecdsa_signature local_60;
  
  ctx = secp256k1_context_no_precomp;
  bVar2 = false;
  bVar3 = false;
  if ((((bytes_out != (uchar *)0x0) && (bVar3 = bVar2, bytes != (uchar *)0x0)) && (bytes_len != 0))
     && (len == 0x40)) {
    iVar1 = secp256k1_ecdsa_signature_parse_der
                      (secp256k1_context_no_precomp,&local_60,bytes,bytes_len);
    if (iVar1 == 0) {
      bVar3 = false;
    }
    else {
      iVar1 = secp256k1_ecdsa_signature_serialize_compact(ctx,bytes_out,&local_60);
      bVar3 = iVar1 != 0;
    }
  }
  if (bytes_out != (uchar *)0x0 && bVar3 == false) {
    wally_clear(bytes_out,len);
  }
  wally_clear(&local_60,0x40);
  return (uint)bVar3 * 2 + -2;
}

Assistant:

int wally_ec_sig_from_der(const unsigned char *bytes, size_t bytes_len,
                          unsigned char *bytes_out, size_t len)
{
    secp256k1_ecdsa_signature sig_secp;
    const secp256k1_context *ctx = secp256k1_context_no_precomp;
    bool ok;

    ok = bytes && bytes_len && bytes_out && len == EC_SIGNATURE_LEN &&
         secp256k1_ecdsa_signature_parse_der(ctx, &sig_secp, bytes, bytes_len) &&
         secp256k1_ecdsa_signature_serialize_compact(ctx, bytes_out, &sig_secp);

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear(&sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}